

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O1

ProgramBinary * __thiscall
vk::BinaryRegistryDetail::BinaryRegistryReader::loadProgram
          (BinaryRegistryReader *this,ProgramIdentifier *id)

{
  BinaryIndexPtr *this_00;
  ulong uVar1;
  int iVar2;
  LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *pLVar3;
  BinaryIndexNode *pBVar4;
  undefined4 extraout_var;
  ProgramBinary *this_01;
  InternalError *pIVar6;
  ProgramNotFoundException *this_02;
  ulong uVar7;
  deUint32 *pdVar8;
  ulong uVar9;
  size_t ndx;
  deUint32 *unaff_R13;
  string fullPath;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  string local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  MovePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> local_60;
  allocator_type local_50 [32];
  long *plVar5;
  
  this_00 = &this->m_binaryIndex;
  if ((this->m_binaryIndex).
      super_UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
      .m_data.ptr == (LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *)0x0) {
    pLVar3 = (LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *)operator_new(0x50);
    unaff_R13 = (deUint32 *)this->m_archive;
    anon_unknown_8::getIndexPath(&local_a0,&this->m_srcPath);
    local_60.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.ptr =
         (Resource *)(**(code **)(*(long *)unaff_R13 + 0x10))(unaff_R13,local_a0._M_dataplus._M_p);
    LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>::LazyResource(pLVar3,&local_60);
    local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (deUint8 *)0x0;
    if ((this_00->
        super_UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
        ).m_data.ptr != pLVar3) {
      de::details::
      UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
      ::reset(&this_00->
               super_UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
             );
      (this_00->
      super_UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
      ).m_data.ptr = pLVar3;
    }
    de::details::
    UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
    ::reset((UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
             *)&local_80);
    if (local_60.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.ptr !=
        (Resource *)0x0) {
      (*(local_60.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.ptr)->
        _vptr_Resource[1])();
      local_60.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.ptr =
           (Resource *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  pLVar3 = (this_00->
           super_UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
           ).m_data.ptr;
  anon_unknown_8::getSearchPath((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0,id)
  ;
  ndx = 0;
  uVar7 = 0;
  do {
    pBVar4 = LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>::operator[](pLVar3,ndx);
    if (pBVar4->word == *(deUint32 *)(local_a0._M_dataplus._M_p + uVar7 * 4)) {
      uVar1 = uVar7 + 1;
      uVar9 = (long)(local_a0._M_string_length - (long)local_a0._M_dataplus._M_p) >> 2;
      if (uVar1 < uVar9) {
        ndx = (size_t)pBVar4->index;
        pdVar8 = (deUint32 *)&DAT_00000001;
        uVar7 = uVar1;
        if ((ulong)((long)(pLVar3->m_elements).
                          super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pLVar3->m_elements).
                          super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= ndx) {
          pIVar6 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    (pIVar6,(char *)0x0,"(size_t)curNode.index < index->size()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkBinaryRegistry.cpp"
                     ,0xc1);
LAB_00a0a163:
          __cxa_throw(pIVar6,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
        }
      }
      else {
        pdVar8 = (deUint32 *)0x0;
        unaff_R13 = &pBVar4->index;
        if (uVar1 != uVar9) {
          unaff_R13 = pdVar8;
        }
      }
    }
    else if (pBVar4->word == 0) {
      pdVar8 = (deUint32 *)0x0;
      unaff_R13 = (deUint32 *)0x0;
    }
    else {
      ndx = ndx + 1;
      pdVar8 = (deUint32 *)&DAT_00000001;
      if ((ulong)((long)(pLVar3->m_elements).
                        super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pLVar3->m_elements).
                        super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= ndx) {
        pIVar6 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (pIVar6,(char *)0x0,"nodeNdx < index->size()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkBinaryRegistry.cpp"
                   ,0xd0);
        goto LAB_00a0a163;
      }
    }
    if ((char)pdVar8 == '\0') {
      if (local_a0._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_a0._M_dataplus._M_p,
                        local_a0.field_2._M_allocated_capacity - (long)local_a0._M_dataplus._M_p);
      }
      if (unaff_R13 == (deUint32 *)0x0) {
        this_02 = (ProgramNotFoundException *)__cxa_allocate_exception(0x38);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Program not found in index","");
        ProgramNotFoundException::ProgramNotFoundException(this_02,id,&local_a0);
        __cxa_throw(this_02,&ProgramNotFoundException::typeinfo,tcu::Exception::~Exception);
      }
      anon_unknown_8::getProgramPath(&local_a0,&this->m_srcPath,*unaff_R13);
      iVar2 = (*this->m_archive->_vptr_Archive[2])(this->m_archive,local_a0._M_dataplus._M_p);
      plVar5 = (long *)CONCAT44(extraout_var,iVar2);
      iVar2 = (**(code **)(*plVar5 + 0x18))(plVar5);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_80,(long)iVar2,local_50);
      if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pIVar6 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (pIVar6,(char *)0x0,"!bytes.empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkBinaryRegistry.cpp"
                   ,0x25b);
        __cxa_throw(pIVar6,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(*plVar5 + 0x10))
                (plVar5,local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,iVar2);
      this_01 = (ProgramBinary *)operator_new(0x20);
      ProgramBinary::ProgramBinary
                (this_01,PROGRAM_FORMAT_SPIRV,
                 (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                 local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (deUint8 *)0x0) {
        operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_80.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      (**(code **)(*plVar5 + 8))(plVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      return this_01;
    }
  } while( true );
}

Assistant:

ProgramBinary* BinaryRegistryReader::loadProgram (const ProgramIdentifier& id) const
{
	if (!m_binaryIndex)
	{
		try
		{
			m_binaryIndex = BinaryIndexPtr(new BinaryIndexAccess(de::MovePtr<tcu::Resource>(m_archive.getResource(getIndexPath(m_srcPath).c_str()))));
		}
		catch (const tcu::ResourceError& e)
		{
			throw ProgramNotFoundException(id, string("Failed to open binary index (") + e.what() + ")");
		}
	}

	{
		const deUint32*	indexPos	= findBinaryIndex(m_binaryIndex.get(), id);

		if (indexPos)
		{
			const string	fullPath	= getProgramPath(m_srcPath, *indexPos);

			try
			{
				de::UniquePtr<tcu::Resource>	progRes		(m_archive.getResource(fullPath.c_str()));
				const int						progSize	= progRes->getSize();
				vector<deUint8>					bytes		(progSize);

				TCU_CHECK_INTERNAL(!bytes.empty());

				progRes->read(&bytes[0], progSize);

				return new ProgramBinary(vk::PROGRAM_FORMAT_SPIRV, bytes.size(), &bytes[0]);
			}
			catch (const tcu::ResourceError& e)
			{
				throw ProgramNotFoundException(id, e.what());
			}
		}
		else
			throw ProgramNotFoundException(id, "Program not found in index");
	}
}